

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spscqueue.h
# Opt level: O2

void __thiscall spsc_queue<int>::spsc_queue(spsc_queue<int> *this,size_t prealloc)

{
  node *pnVar1;
  size_t sVar2;
  bool bVar3;
  int dummy;
  
  pnVar1 = (node *)operator_new(0x10);
  pnVar1->next_ = (node *)0x0;
  this->tail_copy_ = pnVar1;
  this->first_ = pnVar1;
  this->head_ = pnVar1;
  this->tail_ = pnVar1;
  dummy = 0;
  sVar2 = prealloc;
  while (bVar3 = sVar2 != 0, sVar2 = sVar2 - 1, bVar3) {
    enqueue(this,0);
  }
  while (bVar3 = prealloc != 0, prealloc = prealloc - 1, bVar3) {
    try_dequeue(this,&dummy);
  }
  return;
}

Assistant:

explicit spsc_queue(size_t prealloc)
  {
      node* n = new node;
      n->next_ = 0;
      tail_ = head_ = first_ = tail_copy_ = n;

      // [CD] Not (at all) the most efficient way to pre-allocate memory, but it works
      T dummy = T();
      for (size_t i = 0; i != prealloc; ++i) {
          enqueue(dummy);
      }
      for (size_t i = 0; i != prealloc; ++i) {
          try_dequeue(dummy);
      }
  }